

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yajl_test.c
# Opt level: O3

void * yajlTestRealloc(void *ctx,void *ptr,size_t sz)

{
  void *pvVar1;
  
  if (ptr == (void *)0x0) {
    ctx = (void *)((long)ctx + 4);
  }
  else if (sz != 0) goto LAB_001026a2;
  *(int *)ctx = *ctx + 1;
LAB_001026a2:
  pvVar1 = realloc(ptr,sz);
  return pvVar1;
}

Assistant:

static void * yajlTestRealloc(void * ctx, void * ptr, size_t sz)
{
    if (ptr == NULL) {
        assert(sz != 0);
        TEST_CTX(ctx)->numMallocs++;
    } else if (sz == 0) {
        TEST_CTX(ctx)->numFrees++;
    }

    return realloc(ptr, sz);
}